

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O1

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
         *this)

{
  code *pcVar1;
  SmallVectorBase<std::pair<int,int>> *pSVar2;
  int iVar3;
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_> obj;
  int local_68;
  int local_64;
  undefined1 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_58 = 0;
  local_50 = 3;
  iVar3 = 1;
  local_60 = local_48;
  do {
    local_68 = iVar3;
    local_64 = iVar3;
    slang::SmallVectorBase<std::pair<int,int>>::emplace_back<int,int>
              ((SmallVectorBase<std::pair<int,int>> *)&local_60,&local_64,&local_68);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  pcVar1 = (code *)this->m_testAsMethod;
  pSVar2 = (SmallVectorBase<std::pair<int,int>> *)&local_60 + *(long *)&this->field_0x10;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pSVar2 + -1);
  }
  (*pcVar1)(pSVar2);
  if (local_60 != local_48) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }